

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O0

void __thiscall
CheckedSharedMutexTest_UnmatchUnlock_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedMutexTest_UnmatchUnlock_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  AssertHelper local_1d8;
  Message local_1d0 [6];
  exception *e_2;
  TrueWithString gtest_msg_2;
  Message local_178 [2];
  system_error *anon_var_0;
  type e_1;
  undefined1 local_138 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg_1;
  AssertHelper local_f8;
  Message local_f0 [6];
  exception *e;
  undefined1 local_b0 [8];
  TrueWithString gtest_msg;
  TypeParam mtx;
  CheckedSharedMutexTest_UnmatchUnlock_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
  *this_local;
  
  yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_mutex
            ((basic_shared_mutex<yamc::rwlock::ReaderPrefer> *)
             (gtest_msg.value.field_2._M_local_buf + 8));
  memset(local_b0,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_b0);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_b0);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock_shared
                ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)
                 ((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_1.value.field_2 + 8),
                   "Expected: mtx.lock_shared() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x153,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)(gtest_msg_1.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_f0);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_b0);
  if ((int)e != 0) goto LAB_0020cb50;
  memset(local_138,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_138);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_138);
  if (bVar1) {
    e_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock
                ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)
                 ((long)&gtest_msg.value.field_2 + 8));
    }
    if ((e_1._7_1_ & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)local_138,
                 "Expected: mtx.unlock() throws an exception of type std::system_error.\n  Actual: it throws nothing."
                );
      goto LAB_0020c73e;
    }
  }
  else {
LAB_0020c73e:
    testing::Message::Message(local_178);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&gtest_msg_2.value.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x154,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&gtest_msg_2.value.field_2 + 8),local_178);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&gtest_msg_2.value.field_2 + 8));
    testing::Message::~Message(local_178);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_138);
  memset(&e_2,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_2);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_2);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared
                ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)
                 ((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_1d0);
    std::operator+(&local_1f8,
                   "Expected: mtx.unlock_shared() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x155,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    testing::Message::~Message(local_1d0);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_2);
  if ((int)e == 0) {
    e._0_4_ = 0;
  }
LAB_0020cb50:
  yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_mutex
            ((basic_shared_mutex<yamc::rwlock::ReaderPrefer> *)
             (gtest_msg.value.field_2._M_local_buf + 8));
  return;
}

Assistant:

TYPED_TEST(CheckedSharedMutexTest, UnmatchUnlock) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock_shared());
  EXPECT_CHECK_FAILURE(mtx.unlock());
  ASSERT_NO_THROW(mtx.unlock_shared());
}